

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

bool __thiscall
QDockWidgetGroupWindow::eventFilter(QDockWidgetGroupWindow *this,QObject *obj,QEvent *event)

{
  undefined1 uVar1;
  QDockWidget *dockWidget;
  
  dockWidget = (QDockWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
  if (dockWidget != (QDockWidget *)0x0) {
    if (*(short *)(event + 8) == 0x12) {
      if ((((dockWidget->super_QWidget).data)->widget_attributes & 0x8000) != 0) {
        QWidget::hide((QWidget *)this);
      }
    }
    else if (*(short *)(event + 8) == 0x13) {
      reparentToMainWindow(this,dockWidget);
      QDockWidget::setFloating(dockWidget,false);
    }
  }
  uVar1 = QObject::eventFilter((QObject *)this,(QEvent *)obj);
  return (bool)uVar1;
}

Assistant:

bool QDockWidgetGroupWindow::eventFilter(QObject *obj, QEvent *event)
{
    auto *dockWidget = qobject_cast<QDockWidget *>(obj);
    if (!dockWidget)
        return QWidget::eventFilter(obj, event);

    switch (event->type()) {
    case QEvent::Close:
        // We don't want closed dock widgets in a floating tab
        // => dock it to the main dock, before closing;
        reparentToMainWindow(dockWidget);
        dockWidget->setFloating(false);
        break;

    case QEvent::Hide:
        // if the dock widget is not an active tab, it is hidden anyway.
        // if it is the active tab, hide the whole group.
        if (dockWidget->isVisible())
            hide();
        break;

    default:
        break;
    }
    return QWidget::eventFilter(obj, event);
}